

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  byte bVar4;
  Index IVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  bool bVar9;
  
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    bVar3 = 3;
  }
  else if (iVar1 == 1) {
    bVar3 = 1;
  }
  else if (iVar1 == 0) {
    IVar5 = BindingHash::FindIndex(&module->table_bindings,(Var *)(this + 0x28));
    bVar3 = (IVar5 != 0 || *(int *)(this + 0x70) != -0x10) * '\x02';
  }
  else {
    bVar3 = 0;
  }
  if (*(int *)(this + 0x70) != -0x10) {
    bVar9 = false;
    goto LAB_0014950e;
  }
  plVar7 = *(long **)(this + 0x90);
  plVar2 = *(long **)(this + 0x98);
  lVar8 = ((long)plVar2 - (long)plVar7 >> 3) * -0x5555555555555555 >> 2;
  plVar6 = plVar7;
  if (0 < lVar8) {
    plVar6 = plVar7 + lVar8 * 0xc;
    lVar8 = lVar8 + 1;
    plVar7 = plVar7 + 6;
    do {
      if (plVar7[-4] == 0) goto LAB_00149523;
      if (*(int *)(plVar7[-6] + 0x38) != 0x24) {
        plVar7 = plVar7 + -6;
        goto LAB_00149508;
      }
      if (plVar7[-1] == 0) goto LAB_00149523;
      if (*(int *)(plVar7[-3] + 0x38) != 0x24) {
        plVar7 = plVar7 + -3;
        goto LAB_00149508;
      }
      if (plVar7[2] == 0) goto LAB_00149523;
      if (*(int *)(*plVar7 + 0x38) != 0x24) goto LAB_00149508;
      if (plVar7[5] == 0) goto LAB_00149523;
      if (*(int *)(plVar7[3] + 0x38) != 0x24) {
        plVar7 = plVar7 + 3;
        goto LAB_00149508;
      }
      lVar8 = lVar8 + -1;
      plVar7 = plVar7 + 0xc;
    } while (1 < lVar8);
  }
  lVar8 = ((long)plVar2 - (long)plVar6 >> 3) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_001494dd:
    if (plVar6[2] == 0) {
LAB_00149523:
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x18a,
                    "typename intrusive_list<T>::const_reference wabt::intrusive_list<wabt::Expr>::front() const [T = wabt::Expr]"
                   );
    }
    plVar7 = plVar6;
    if (*(int *)(*plVar6 + 0x38) == 0x24) {
      plVar7 = plVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_001494c9:
    if (plVar6[2] == 0) goto LAB_00149523;
    plVar7 = plVar6;
    if (*(int *)(*plVar6 + 0x38) == 0x24) {
      plVar6 = plVar6 + 3;
      goto LAB_001494dd;
    }
  }
  else {
    plVar7 = plVar2;
    if (lVar8 == 3) {
      if (plVar6[2] == 0) goto LAB_00149523;
      plVar7 = plVar6;
      if (*(int *)(*plVar6 + 0x38) == 0x24) {
        plVar6 = plVar6 + 3;
        goto LAB_001494c9;
      }
    }
  }
LAB_00149508:
  bVar9 = plVar7 == plVar2;
LAB_0014950e:
  bVar4 = bVar3 | 4;
  if (bVar9) {
    bVar4 = bVar3;
  }
  return bVar4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}